

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::RemoveLast
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field)

{
  long lVar1;
  undefined8 *puVar2;
  bool bVar3;
  uint32 uVar4;
  Type TVar5;
  int iVar6;
  MapFieldBase *this_00;
  LogMessage *pLVar7;
  ulong uVar8;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (*(Descriptor **)(field + 0x58) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"RemoveLast","Field does not match message type.");
  }
  if (*(int *)(field + 0x4c) != 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"RemoveLast",
               "Field is singular; the method requires a repeated field.");
  }
  if (field[0x50] == (FieldDescriptor)0x1) {
    uVar4 = ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    ExtensionSet::RemoveLast
              ((ExtensionSet *)
               ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4),
               *(int *)(field + 0x38));
    return;
  }
  TVar5 = FieldDescriptor::type(field);
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar5 * 4)) {
  case 1:
    uVar4 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
    uVar8 = (ulong)uVar4;
    iVar6 = *(int *)((long)&(message->super_MessageLite)._vptr_MessageLite + uVar8);
    if (iVar6 < 1) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x496);
      pLVar7 = LogMessage::operator<<(&local_58,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_59,pLVar7);
LAB_005aac63:
      LogMessage::~LogMessage(&local_58);
      iVar6 = *(int *)((long)&(message->super_MessageLite)._vptr_MessageLite + uVar8);
    }
    break;
  case 2:
    uVar4 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
    uVar8 = (ulong)uVar4;
    iVar6 = *(int *)((long)&(message->super_MessageLite)._vptr_MessageLite + uVar8);
    if (iVar6 < 1) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x496);
      pLVar7 = LogMessage::operator<<(&local_58,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_59,pLVar7);
      goto LAB_005aac63;
    }
    break;
  case 3:
    uVar4 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
    uVar8 = (ulong)uVar4;
    iVar6 = *(int *)((long)&(message->super_MessageLite)._vptr_MessageLite + uVar8);
    if (iVar6 < 1) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x496);
      pLVar7 = LogMessage::operator<<(&local_58,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_59,pLVar7);
      goto LAB_005aac63;
    }
    break;
  case 4:
    uVar4 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
    uVar8 = (ulong)uVar4;
    iVar6 = *(int *)((long)&(message->super_MessageLite)._vptr_MessageLite + uVar8);
    if (iVar6 < 1) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x496);
      pLVar7 = LogMessage::operator<<(&local_58,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_59,pLVar7);
      goto LAB_005aac63;
    }
    break;
  case 5:
    uVar4 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
    uVar8 = (ulong)uVar4;
    iVar6 = *(int *)((long)&(message->super_MessageLite)._vptr_MessageLite + uVar8);
    if (iVar6 < 1) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x496);
      pLVar7 = LogMessage::operator<<(&local_58,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_59,pLVar7);
      goto LAB_005aac63;
    }
    break;
  case 6:
    uVar4 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
    uVar8 = (ulong)uVar4;
    iVar6 = *(int *)((long)&(message->super_MessageLite)._vptr_MessageLite + uVar8);
    if (iVar6 < 1) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x496);
      pLVar7 = LogMessage::operator<<(&local_58,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_59,pLVar7);
      goto LAB_005aac63;
    }
    break;
  case 7:
    uVar4 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
    uVar8 = (ulong)uVar4;
    iVar6 = *(int *)((long)&(message->super_MessageLite)._vptr_MessageLite + uVar8);
    if (iVar6 < 1) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x496);
      pLVar7 = LogMessage::operator<<(&local_58,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_59,pLVar7);
      goto LAB_005aac63;
    }
    break;
  case 8:
    uVar4 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
    uVar8 = (ulong)uVar4;
    iVar6 = *(int *)((long)&(message->super_MessageLite)._vptr_MessageLite + uVar8);
    if (iVar6 < 1) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x496);
      pLVar7 = LogMessage::operator<<(&local_58,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_59,pLVar7);
      goto LAB_005aac63;
    }
    break;
  case 9:
    uVar4 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
    uVar8 = (ulong)uVar4;
    iVar6 = *(int *)((long)&message[1].super_MessageLite._vptr_MessageLite + uVar8);
    if (iVar6 < 1) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x603);
      pLVar7 = LogMessage::operator<<(&local_58,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_59,pLVar7);
      LogMessage::~LogMessage(&local_58);
      iVar6 = *(int *)((long)&message[1].super_MessageLite._vptr_MessageLite + uVar8);
    }
    lVar1 = *(long *)((long)&message[2].super_MessageLite._vptr_MessageLite + uVar8);
    *(int *)((long)&message[1].super_MessageLite._vptr_MessageLite + uVar8) = iVar6 + -1;
    puVar2 = *(undefined8 **)(lVar1 + (long)iVar6 * 8);
    puVar2[1] = 0;
    *(undefined1 *)*puVar2 = 0;
    return;
  case 10:
    bVar3 = FieldDescriptor::is_map(field);
    uVar4 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
    this_00 = (MapFieldBase *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4)
    ;
    if (bVar3) {
      this_00 = (MapFieldBase *)MapFieldBase::MutableRepeatedField(this_00);
      iVar6 = *(int *)&this_00->arena_;
      if (iVar6 < 1) {
        LogMessage::LogMessage
                  (&local_58,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x603);
        pLVar7 = LogMessage::operator<<(&local_58,"CHECK failed: (current_size_) > (0): ");
        LogFinisher::operator=(&local_59,pLVar7);
LAB_005aad4d:
        LogMessage::~LogMessage(&local_58);
        iVar6 = *(int *)&this_00->arena_;
      }
    }
    else {
      iVar6 = *(int *)&this_00->arena_;
      if (iVar6 < 1) {
        LogMessage::LogMessage
                  (&local_58,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x603);
        pLVar7 = LogMessage::operator<<(&local_58,"CHECK failed: (current_size_) > (0): ");
        LogFinisher::operator=(&local_59,pLVar7);
        goto LAB_005aad4d;
      }
    }
    *(int *)&this_00->arena_ = iVar6 + -1;
    (**(code **)(*((Rep *)this_00->repeated_field_)->elements[(long)iVar6 + -1] + 0x38))();
  default:
    goto switchD_005aa909_default;
  }
  *(int *)((long)&(message->super_MessageLite)._vptr_MessageLite + uVar8) = iVar6 + -1;
switchD_005aa909_default:
  return;
}

Assistant:

void GeneratedMessageReflection::RemoveLast(
    Message* message,
    const FieldDescriptor* field) const {
  USAGE_CHECK_MESSAGE_TYPE(RemoveLast);
  USAGE_CHECK_REPEATED(RemoveLast);

  if (field->is_extension()) {
    MutableExtensionSet(message)->RemoveLast(field->number());
  } else {
    switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                                     \
      case FieldDescriptor::CPPTYPE_##UPPERCASE :                             \
        MutableRaw<RepeatedField<LOWERCASE> >(message, field)->RemoveLast();  \
        break

      HANDLE_TYPE( INT32,  int32);
      HANDLE_TYPE( INT64,  int64);
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE( FLOAT,  float);
      HANDLE_TYPE(  BOOL,   bool);
      HANDLE_TYPE(  ENUM,    int);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_STRING:
        switch (field->options().ctype()) {
          default:  // TODO(kenton):  Support other string reps.
          case FieldOptions::STRING:
            MutableRaw<RepeatedPtrField<string> >(message, field)->RemoveLast();
            break;
        }
        break;

      case FieldDescriptor::CPPTYPE_MESSAGE:
        if (IsMapFieldInApi(field)) {
          MutableRaw<MapFieldBase>(message, field)
              ->MutableRepeatedField()
              ->RemoveLast<GenericTypeHandler<Message> >();
        } else {
          MutableRaw<RepeatedPtrFieldBase>(message, field)
            ->RemoveLast<GenericTypeHandler<Message> >();
        }
        break;
    }
  }
}